

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

type fmt::v7::
     format_to_n<char*,char[10],std::basic_string_view<char,std::char_traits<char>>,unsigned_long,true>
               (char *out,size_t n,char (*format_str) [10],
               basic_string_view<char,_std::char_traits<char>_> *args,unsigned_long *args_1)

{
  basic_string_view<char> format_str_00;
  format_to_n_result<char_*> fVar1;
  type tVar2;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  char *local_38;
  size_t local_30;
  unsigned_long local_28;
  
  local_30 = args->_M_len;
  local_38 = args->_M_str;
  local_28 = *args_1;
  format_str_00 = to_string_view<char,_0>(*format_str);
  args_00.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_38;
  args_00.desc_ = 0x4d;
  fVar1 = vformat_to_n<char_*,_char,_0>(out,n,format_str_00,args_00);
  tVar2.out = fVar1.out;
  tVar2.size = fVar1.size;
  return tVar2;
}

Assistant:

inline auto format_to_n(OutputIt out, size_t n, const S& format_str,
                        const Args&... args) ->
    typename std::enable_if<enable, format_to_n_result<OutputIt>>::type {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return vformat_to_n(out, n, to_string_view(format_str), vargs);
}